

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void d68020_link_32(m68k_info *info)

{
  m68k_info *in_RDI;
  m68k_info *unaff_retaddr;
  
  if ((in_RDI->type & 0x1c) == 0) {
    d68000_invalid((m68k_info *)0x3a3993);
  }
  else {
    read_imm_32(in_RDI);
    build_link(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  }
  return;
}

Assistant:

static void d68020_link_32(m68k_info *info)
{
	LIMIT_CPU_TYPES(info, M68020_PLUS);
	build_link(info, read_imm_32(info), 4);
}